

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<26>::DiscreteTwoBodyScattering::TabulatedDistribution::generateList
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *cosines,
          vector<double,_std::allocator<double>_> *probabilities)

{
  ulong uVar1;
  undefined8 *puVar2;
  char *unaff_RBX;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (long)(cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar3 = uVar1 >> 3;
  if (uVar1 == (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar4 = 0; (uVar3 & 0xffffffff) << 3 != lVar4; lVar4 = lVar4 + 8) {
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict2 *)
                 ((long)(cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar4));
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,
                 (value_type_conflict2 *)
                 ((long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                        .super__Vector_impl_data._M_start + lVar4));
    }
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,unsigned_int>("cosines.size(): {}",(uint)uVar3);
  tools::Log::info<char_const*,unsigned_long>
            ("probabilities.size(): {}",
             (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( std::vector< double >&& cosines,
              std::vector< double >&& probabilities ) {

  unsigned int NL = cosines.size();
  if ( cosines.size() != probabilities.size() ) {

    Log::info( "The number of cosine and probability values must be the same" );
    Log::info( "cosines.size(): {}", NL );
    Log::info( "probabilities.size(): {}", probabilities.size() );
    throw std::exception();
  }

  std::vector< double > list;
  for ( unsigned int i = 0; i < NL; ++i ) {

    list.push_back( cosines[i] );
    list.push_back( probabilities[i] );
  }
  return list;
}